

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O2

Vec_Int_t * Gia_VtaConvertFromGla(Gia_Man_t *p,Vec_Int_t *vGla,int nFrames)

{
  int iVar1;
  ulong uVar2;
  Vec_Int_t *p_00;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  
  uVar7 = p->nObjs;
  uVar3 = 0;
  uVar2 = (ulong)(uint)vGla->nSize;
  if (vGla->nSize < 1) {
    uVar2 = uVar3;
  }
  iVar8 = 0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    iVar8 = iVar8 + vGla->pArray[uVar3];
  }
  iVar1 = Abc_Base2Log(uVar7);
  if (~(-1 << ((byte)iVar1 & 0x1f)) < (int)uVar7) {
    __assert_fail("nObjs <= nObjMask",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absUtil.c"
                  ,0x79,"Vec_Int_t *Gia_VtaConvertFromGla(Gia_Man_t *, Vec_Int_t *, int)");
  }
  p_00 = Vec_IntAlloc(1000);
  Vec_IntPush(p_00,nFrames);
  iVar6 = nFrames + 2;
  iVar5 = iVar8;
  for (iVar4 = 0; iVar4 <= nFrames; iVar4 = iVar4 + 1) {
    Vec_IntPush(p_00,iVar6);
    iVar6 = iVar6 + iVar5;
    iVar5 = iVar5 + iVar8;
  }
  iVar8 = 0;
  if (0 < nFrames) {
    iVar8 = nFrames;
  }
  for (iVar5 = 1; iVar5 != iVar8 + 1; iVar5 = iVar5 + 1) {
    for (iVar4 = 0; iVar4 != iVar5; iVar4 = iVar4 + 1) {
      for (uVar7 = 0; (int)uVar7 < vGla->nSize; uVar7 = uVar7 + 1) {
        iVar6 = Vec_IntEntry(vGla,uVar7);
        if (iVar6 != 0) {
          Vec_IntPush(p_00,uVar7 | iVar4 << ((byte)iVar1 & 0x1f));
        }
      }
    }
  }
  Vec_IntEntry(p_00,nFrames + 1);
  iVar8 = Vec_IntEntry(p_00,nFrames + 1);
  if (iVar8 == p_00->nSize) {
    return p_00;
  }
  __assert_fail("Vec_IntEntry(vVta, nFrames+1) == Vec_IntSize(vVta)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absUtil.c"
                ,0x86,"Vec_Int_t *Gia_VtaConvertFromGla(Gia_Man_t *, Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Gia_VtaConvertFromGla( Gia_Man_t * p, Vec_Int_t * vGla, int nFrames )
{
    Vec_Int_t * vVta;
    int nObjBits, nObjMask, nObjs = Gia_ManObjNum(p);
    int i, k, j, Entry, Counter, nGlaSize;
    //. get the GLA size
    nGlaSize = Vec_IntSum(vGla);
    // get the bitmask
    nObjBits = Abc_Base2Log(nObjs);
    nObjMask = (1 << Abc_Base2Log(nObjs)) - 1;
    assert( nObjs <= nObjMask );
    // go through objects
    vVta = Vec_IntAlloc( 1000 );
    Vec_IntPush( vVta, nFrames );
    Counter = nFrames + 2;
    for ( i = 0; i <= nFrames; i++, Counter += i * nGlaSize )
        Vec_IntPush( vVta, Counter );
    for ( i = 0; i < nFrames; i++ )
        for ( k = 0; k <= i; k++ )
            Vec_IntForEachEntry( vGla, Entry, j )
                if ( Entry ) 
                    Vec_IntPush( vVta, (k << nObjBits) | j );
    Counter = Vec_IntEntry(vVta, nFrames+1);
    assert( Vec_IntEntry(vVta, nFrames+1) == Vec_IntSize(vVta) );
    return vVta;
}